

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void av1_crc32c_calculator_init(CRC32C *p_crc32c)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  int n;
  long lVar6;
  uint32_t *puVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar19;
  uint uVar20;
  undefined1 auVar18 [16];
  uint uVar21;
  uint uVar23;
  uint uVar24;
  undefined1 auVar22 [16];
  uint uVar25;
  uint uVar26;
  undefined1 auVar17 [12];
  
  auVar5 = _DAT_004cbde0;
  uVar11 = 0;
  uVar12 = 1;
  uVar13 = 2;
  uVar14 = 3;
  lVar6 = 0;
  auVar9 = _DAT_004ca1d0;
  auVar10 = _DAT_004ca1e0;
  do {
    auVar18 = auVar10 & auVar5;
    auVar22 = auVar9 & auVar5;
    sVar1 = auVar18._0_2_;
    sVar2 = auVar18._2_2_;
    sVar3 = auVar18._4_2_;
    sVar4 = auVar18._6_2_;
    iVar15 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar18[6] - (0xff < sVar4),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3),
                               CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar18[2] - (0xff < sVar2),
                                        (0 < sVar1) * (sVar1 < 0x100) * auVar18[0] - (0xff < sVar1))
                              ));
    sVar1 = auVar18._8_2_;
    sVar2 = auVar18._10_2_;
    sVar3 = auVar18._12_2_;
    sVar4 = auVar18._14_2_;
    auVar17._0_8_ =
         CONCAT17((0 < sVar4) * (sVar4 < 0x100) * auVar18[0xe] - (0xff < sVar4),
                  CONCAT16((0 < sVar3) * (sVar3 < 0x100) * auVar18[0xc] - (0xff < sVar3),
                           CONCAT15((0 < sVar2) * (sVar2 < 0x100) * auVar18[10] - (0xff < sVar2),
                                    CONCAT14((0 < sVar1) * (sVar1 < 0x100) * auVar18[8] -
                                             (0xff < sVar1),iVar15))));
    sVar1 = auVar22._0_2_;
    auVar17[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[0] - (0xff < sVar1);
    sVar1 = auVar22._2_2_;
    auVar17[9] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[2] - (0xff < sVar1);
    sVar1 = auVar22._4_2_;
    auVar17[10] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[4] - (0xff < sVar1);
    sVar1 = auVar22._6_2_;
    auVar17[0xb] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[6] - (0xff < sVar1);
    sVar1 = auVar22._8_2_;
    auVar18[0xc] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[8] - (0xff < sVar1);
    auVar18._0_12_ = auVar17;
    sVar1 = auVar22._10_2_;
    auVar18[0xd] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[10] - (0xff < sVar1);
    sVar1 = auVar22._12_2_;
    auVar18[0xe] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[0xc] - (0xff < sVar1);
    sVar1 = auVar22._14_2_;
    auVar18[0xf] = (0 < sVar1) * (sVar1 < 0x100) * auVar22[0xe] - (0xff < sVar1);
    uVar16 = -(uint)(iVar15 == 0);
    uVar19 = -(uint)((int)((ulong)auVar17._0_8_ >> 0x20) == 0);
    uVar20 = -(uint)(auVar17._8_4_ == 0);
    uVar21 = -(uint)(auVar18._12_4_ == 0);
    uVar16 = ~uVar16 & (uVar11 >> 1 ^ 0x82f63b78) | uVar11 >> 1 & uVar16;
    uVar19 = ~uVar19 & (uVar12 >> 1 ^ 0x82f63b78) | uVar12 >> 1 & uVar19;
    uVar20 = ~uVar20 & (uVar13 >> 1 ^ 0x82f63b78) | uVar13 >> 1 & uVar20;
    uVar21 = ~uVar21 & (uVar14 >> 1 ^ 0x82f63b78) | uVar14 >> 1 & uVar21;
    uVar23 = uVar19 >> 1;
    uVar24 = uVar20 >> 1;
    uVar25 = uVar21 >> 1;
    uVar19 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar20 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar21 = (int)(uVar21 << 0x1f) >> 0x1f;
    uVar19 = (uVar23 ^ 0x82f63b78) & uVar19 | ~uVar19 & uVar23;
    uVar20 = (uVar24 ^ 0x82f63b78) & uVar20 | ~uVar20 & uVar24;
    uVar21 = (uVar25 ^ 0x82f63b78) & uVar21 | ~uVar21 & uVar25;
    uVar23 = (int)((uVar16 >> 1) << 0x1f) >> 0x1f;
    uVar24 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar25 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar26 = (int)(uVar21 << 0x1f) >> 0x1f;
    uVar16 = uVar16 >> 2;
    uVar19 = uVar19 >> 1;
    uVar20 = uVar20 >> 1;
    uVar21 = uVar21 >> 1;
    uVar16 = (uVar16 ^ 0x82f63b78) & uVar23 | ~uVar23 & uVar16;
    uVar19 = (uVar19 ^ 0x82f63b78) & uVar24 | ~uVar24 & uVar19;
    uVar20 = (uVar20 ^ 0x82f63b78) & uVar25 | ~uVar25 & uVar20;
    uVar21 = (uVar21 ^ 0x82f63b78) & uVar26 | ~uVar26 & uVar21;
    uVar23 = uVar16 >> 1;
    uVar24 = uVar19 >> 1;
    uVar25 = uVar20 >> 1;
    uVar26 = uVar21 >> 1;
    uVar16 = (int)(uVar16 << 0x1f) >> 0x1f;
    uVar19 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar20 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar21 = (int)(uVar21 << 0x1f) >> 0x1f;
    uVar23 = (uVar23 ^ 0x82f63b78) & uVar16 | ~uVar16 & uVar23;
    uVar24 = (uVar24 ^ 0x82f63b78) & uVar19 | ~uVar19 & uVar24;
    uVar25 = (uVar25 ^ 0x82f63b78) & uVar20 | ~uVar20 & uVar25;
    uVar26 = (uVar26 ^ 0x82f63b78) & uVar21 | ~uVar21 & uVar26;
    uVar16 = uVar23 >> 1;
    uVar19 = uVar24 >> 1;
    uVar20 = uVar25 >> 1;
    uVar21 = uVar26 >> 1;
    uVar23 = (int)(uVar23 << 0x1f) >> 0x1f;
    uVar24 = (int)(uVar24 << 0x1f) >> 0x1f;
    uVar25 = (int)(uVar25 << 0x1f) >> 0x1f;
    uVar26 = (int)(uVar26 << 0x1f) >> 0x1f;
    uVar16 = (uVar16 ^ 0x82f63b78) & uVar23 | ~uVar23 & uVar16;
    uVar19 = (uVar19 ^ 0x82f63b78) & uVar24 | ~uVar24 & uVar19;
    uVar20 = (uVar20 ^ 0x82f63b78) & uVar25 | ~uVar25 & uVar20;
    uVar21 = (uVar21 ^ 0x82f63b78) & uVar26 | ~uVar26 & uVar21;
    uVar23 = uVar16 >> 1;
    uVar24 = uVar19 >> 1;
    uVar25 = uVar20 >> 1;
    uVar26 = uVar21 >> 1;
    uVar16 = (int)(uVar16 << 0x1f) >> 0x1f;
    uVar19 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar20 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar21 = (int)(uVar21 << 0x1f) >> 0x1f;
    uVar16 = (uVar23 ^ 0x82f63b78) & uVar16 | ~uVar16 & uVar23;
    uVar19 = (uVar24 ^ 0x82f63b78) & uVar19 | ~uVar19 & uVar24;
    uVar20 = (uVar25 ^ 0x82f63b78) & uVar20 | ~uVar20 & uVar25;
    uVar21 = (uVar26 ^ 0x82f63b78) & uVar21 | ~uVar21 & uVar26;
    uVar23 = (int)(uVar16 << 0x1f) >> 0x1f;
    uVar24 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar25 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar26 = (int)(uVar21 << 0x1f) >> 0x1f;
    uVar16 = uVar16 >> 1;
    uVar19 = uVar19 >> 1;
    uVar20 = uVar20 >> 1;
    uVar21 = uVar21 >> 1;
    uVar16 = (uVar16 ^ 0x82f63b78) & uVar23 | ~uVar23 & uVar16;
    uVar19 = (uVar19 ^ 0x82f63b78) & uVar24 | ~uVar24 & uVar19;
    uVar20 = (uVar20 ^ 0x82f63b78) & uVar25 | ~uVar25 & uVar20;
    uVar21 = (uVar21 ^ 0x82f63b78) & uVar26 | ~uVar26 & uVar21;
    uVar23 = uVar16 >> 1;
    uVar24 = uVar19 >> 1;
    uVar25 = uVar20 >> 1;
    uVar26 = uVar21 >> 1;
    uVar16 = (int)(uVar16 << 0x1f) >> 0x1f;
    uVar19 = (int)(uVar19 << 0x1f) >> 0x1f;
    uVar20 = (int)(uVar20 << 0x1f) >> 0x1f;
    uVar21 = (int)(uVar21 << 0x1f) >> 0x1f;
    puVar7 = p_crc32c->table[0] + lVar6;
    *puVar7 = (uVar23 ^ 0x82f63b78) & uVar16 | ~uVar16 & uVar23;
    puVar7[1] = (uVar24 ^ 0x82f63b78) & uVar19 | ~uVar19 & uVar24;
    puVar7[2] = (uVar25 ^ 0x82f63b78) & uVar20 | ~uVar20 & uVar25;
    puVar7[3] = (uVar26 ^ 0x82f63b78) & uVar21 | ~uVar21 & uVar26;
    lVar6 = lVar6 + 4;
    lVar8 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 4;
    auVar10._8_8_ = lVar8 + 4;
    lVar8 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 4;
    auVar9._8_8_ = lVar8 + 4;
    uVar11 = uVar11 + 4;
    uVar12 = uVar12 + 4;
    uVar13 = uVar13 + 4;
    uVar14 = uVar14 + 4;
  } while (lVar6 != 0x100);
  lVar6 = 0;
  puVar7 = (uint32_t *)p_crc32c;
  do {
    uVar11 = p_crc32c->table[0][lVar6];
    lVar8 = 0x400;
    do {
      uVar11 = uVar11 >> 8 ^ p_crc32c->table[0][uVar11 & 0xff];
      *(uint *)((long)puVar7 + lVar8) = uVar11;
      lVar8 = lVar8 + 0x400;
    } while (lVar8 != 0x2000);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 1;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

void av1_crc32c_calculator_init(CRC32C *p_crc32c) {
  uint32_t crc;

  for (int n = 0; n < 256; n++) {
    crc = n;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    p_crc32c->table[0][n] = crc;
  }
  for (int n = 0; n < 256; n++) {
    crc = p_crc32c->table[0][n];
    for (int k = 1; k < 8; k++) {
      crc = p_crc32c->table[0][crc & 0xff] ^ (crc >> 8);
      p_crc32c->table[k][n] = crc;
    }
  }
}